

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long&,unsigned_int&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args,
          uint *args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffae0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffae8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffaf0;
  basic_appender<char> *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb28;
  level_enum in_stack_fffffffffffffb4c;
  log_msg *in_stack_fffffffffffffb50;
  string_view_t in_stack_fffffffffffffb58;
  string_view_t in_stack_fffffffffffffb68;
  source_loc in_stack_fffffffffffffb80;
  basic_string_view<char> local_428 [2];
  undefined8 local_408;
  undefined8 uStack_400;
  log_msg *local_3f8;
  buffer<char> *local_390;
  undefined8 local_388 [2];
  undefined4 local_378 [6];
  undefined8 local_360;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  basic_appender<char> local_340 [4];
  buffer<char> local_320 [9];
  undefined1 local_1fa;
  byte local_1f9;
  undefined4 *local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  pcVar1 = &stack0x00000008;
  local_1f8 = in_R9;
  local_1f0 = in_R8;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1f9 = should_log(in_stack_fffffffffffffae8,
                         (level_enum)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  local_1fa = details::backtracer::enabled((backtracer *)0x211e63);
  if (((local_1f9 & 1) != 0) || ((bool)local_1fa)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffae0,(allocator<char> *)in_stack_fffffffffffffad8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_340,local_320);
    local_350 = local_1d8;
    local_348 = local_1d0;
    local_100 = local_1f0;
    local_108 = local_1f8;
    local_f8 = *local_1f0;
    local_f0 = local_388;
    local_18 = local_378;
    local_1c = *local_1f8;
    local_e0 = &local_360;
    local_e8 = local_388;
    local_360 = 0x24;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb24;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb20;
    args_00.field_1.args_ = in_stack_fffffffffffffb28.args_;
    local_10 = local_f8;
    local_8 = local_f0;
    local_388[0] = local_f8;
    local_378[0] = local_1c;
    local_358 = local_e8;
    local_390 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb18,fmt_00,args_00);
    local_3f8 = *(log_msg **)(pcVar1 + 0x10);
    local_408 = *(undefined8 *)pcVar1;
    uStack_400 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_320);
    count = ::fmt::v11::detail::buffer<char>::size(local_320);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_428,pcVar1,count);
    uVar2 = uStack_400;
    log_msg_00 = local_3f8;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb80,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb4c,in_stack_fffffffffffffb58);
    log_it_(in_stack_fffffffffffffaf0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x2120f2);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }